

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O2

Path * FileSystemUtils::GetCurrentPath(void)

{
  char *__ptr;
  Path *in_RDI;
  
  in_RDI->_vptr_Path = (_func_int **)&PTR__Path_0011aa10;
  (in_RDI->m_string)._M_dataplus._M_p = (pointer)&(in_RDI->m_string).field_2;
  (in_RDI->m_string)._M_string_length = 0;
  (in_RDI->m_string).field_2._M_local_buf[0] = '\0';
  __ptr = getcwd((char *)0x0,0);
  std::__cxx11::string::assign((char *)&in_RDI->m_string);
  free(__ptr);
  return in_RDI;
}

Assistant:

inline Path GetCurrentPath()
	{
		Path currPath;
#ifdef _WIN32
		std::wstring temp;
		DWORD requiredSize = GetCurrentDirectoryW( 0, NULL );
		if( requiredSize > 0 )
		{
			temp.resize( requiredSize );
			GetCurrentDirectoryW( requiredSize, &temp[0] );
			temp.pop_back();
		}
		currPath = _Win32Utf16ToUtf8( temp );
#else
		char* currdir = getcwd(0,0);
		currPath = currdir;
		free( currdir );
#endif
		
		return currPath;
	}